

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  byte bVar1;
  int iVar2;
  MethodDescriptorProto *from_00;
  void **ppvVar3;
  uint uVar4;
  LogMessage *other;
  MethodDescriptorProto *this_00;
  string *psVar5;
  ServiceOptions *this_01;
  int iVar6;
  ServiceOptions *from_01;
  long lVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xf3e);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->method_).super_RepeatedPtrFieldBase,
             (from->method_).super_RepeatedPtrFieldBase.current_size_ +
             (this->method_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->method_).super_RepeatedPtrFieldBase.current_size_) {
    lVar7 = 0;
    do {
      from_00 = (MethodDescriptorProto *)(from->method_).super_RepeatedPtrFieldBase.elements_[lVar7]
      ;
      iVar2 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
      iVar6 = (this->method_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar6) {
        ppvVar3 = (this->method_).super_RepeatedPtrFieldBase.elements_;
        (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (MethodDescriptorProto *)ppvVar3[iVar2];
      }
      else {
        if (iVar6 == (this->method_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->method_).super_RepeatedPtrFieldBase,iVar6 + 1);
          iVar6 = (this->method_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->method_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>::New();
        ppvVar3 = (this->method_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
        (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = this_00;
      }
      MethodDescriptorProto::MergeFrom(this_00,from_00);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (from->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar4 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      psVar5 = this->name_;
      if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar5 = (string *)operator_new(0x20);
        (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
        psVar5->_M_string_length = 0;
        (psVar5->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar5;
      }
      std::__cxx11::string::_M_assign((string *)psVar5);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 4) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      this_01 = this->options_;
      if (this_01 == (ServiceOptions *)0x0) {
        this_01 = (ServiceOptions *)operator_new(0x60);
        ServiceOptions::ServiceOptions(this_01);
        this->options_ = this_01;
      }
      from_01 = from->options_;
      if (from_01 == (ServiceOptions *)0x0) {
        from_01 = *(ServiceOptions **)(default_instance_ + 0x30);
      }
      ServiceOptions::MergeFrom(this_01,from_01);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  method_.MergeFrom(from.method_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::ServiceOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}